

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitYUV(VP8Io *io,WebPDecParams *p)

{
  long lVar1;
  int dst_stride;
  int width;
  uint8_t *src;
  long *in_RSI;
  long in_RDI;
  int uv_h;
  int uv_w;
  int mb_h;
  int mb_w;
  uint8_t *v_dst;
  uint8_t *u_dst;
  uint8_t *y_dst;
  WebPYUVABuffer *buf;
  WebPDecBuffer *output;
  int iVar2;
  int iVar3;
  int src_stride;
  
  lVar1 = *in_RSI;
  src = (uint8_t *)
        (*(long *)(lVar1 + 0x18) + (long)(*(int *)(in_RDI + 8) >> 1) * (long)*(int *)(lVar1 + 0x34))
  ;
  iVar3 = *(int *)(in_RDI + 0xc);
  iVar2 = *(int *)(in_RDI + 0x10);
  dst_stride = (iVar3 + 1) / 2;
  width = (iVar2 + 1) / 2;
  src_stride = (int)((ulong)(*(long *)(lVar1 + 0x20) +
                            (long)(*(int *)(in_RDI + 8) >> 1) * (long)*(int *)(lVar1 + 0x38)) >>
                    0x20);
  WebPCopyPlane(src,src_stride,(uint8_t *)CONCAT44(iVar3,iVar2),dst_stride,width,0);
  WebPCopyPlane(src,src_stride,(uint8_t *)CONCAT44(iVar3,iVar2),dst_stride,width,0);
  WebPCopyPlane(src,src_stride,(uint8_t *)CONCAT44(iVar3,iVar2),dst_stride,width,0);
  return *(int *)(in_RDI + 0x10);
}

Assistant:

static int EmitYUV(const VP8Io* const io, WebPDecParams* const p) {
  WebPDecBuffer* output = p->output;
  const WebPYUVABuffer* const buf = &output->u.YUVA;
  uint8_t* const y_dst = buf->y + (ptrdiff_t)io->mb_y * buf->y_stride;
  uint8_t* const u_dst = buf->u + (ptrdiff_t)(io->mb_y >> 1) * buf->u_stride;
  uint8_t* const v_dst = buf->v + (ptrdiff_t)(io->mb_y >> 1) * buf->v_stride;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  const int uv_w = (mb_w + 1) / 2;
  const int uv_h = (mb_h + 1) / 2;
  WebPCopyPlane(io->y, io->y_stride, y_dst, buf->y_stride, mb_w, mb_h);
  WebPCopyPlane(io->u, io->uv_stride, u_dst, buf->u_stride, uv_w, uv_h);
  WebPCopyPlane(io->v, io->uv_stride, v_dst, buf->v_stride, uv_w, uv_h);
  return io->mb_h;
}